

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

int flipConePdr(Aig_Man_t *pAig,int directive,int targetCSPropertyIndex,int safetyInvariantPOIndex,
               int absorberCount)

{
  int iVar1;
  char *__s;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  char *fileName;
  Abc_Cex_t *pCex;
  Pdr_Par_t *pPars;
  Pdr_Par_t Pars;
  Aig_Man_t *pAigDupl;
  Aig_Obj_t *pObjTargetPo;
  int i;
  int RetValue;
  int absorberCount_local;
  int safetyInvariantPOIndex_local;
  int targetCSPropertyIndex_local;
  int directive_local;
  Aig_Man_t *pAig_local;
  
  __s = (char *)malloc(0x32);
  sprintf(__s,"%s_%d.%s","kLive",(ulong)(uint)absorberCount,"blif");
  if (((directive == 1) || (directive == 3)) || (directive == 4)) {
    if (safetyInvariantPOIndex == -1) {
      __assert_fail("safetyInvariantPOIndex != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x164,"int flipConePdr(Aig_Man_t *, int, int, int, int)");
    }
    modifyAigToApplySafetyInvar(pAig,targetCSPropertyIndex,safetyInvariantPOIndex);
  }
  Pars.vOutMap = (Vec_Int_t *)pAig;
  p = Aig_ManDupSimple(pAig);
  for (pObjTargetPo._0_4_ = 0; iVar1 = Saig_ManPoNum(p), (int)pObjTargetPo < iVar1;
      pObjTargetPo._0_4_ = (int)pObjTargetPo + 1) {
    pAVar2 = Aig_ManCo(p,(int)pObjTargetPo);
    Aig_ObjChild0Flip(pAVar2);
  }
  Pdr_ManSetDefaultParams((Pdr_Par_t *)&pPars);
  Pars.fReuseProofOblig = 1;
  Pars.fVerbose = 1;
  Pars.fNotVerbose = 1;
  p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Aig_ManCleanup(p);
  iVar1 = Aig_ManCheck(p);
  if (iVar1 != 0) {
    Pdr_ManSolve(p,(Pdr_Par_t *)&pPars);
    if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      pvVar3 = Vec_PtrEntry(p->vSeqModelVec,targetCSPropertyIndex);
      pObjTargetPo._4_4_ = (uint)(pvVar3 == (void *)0x0);
      free(__s);
      for (pObjTargetPo._0_4_ = 0; iVar1 = Saig_ManPoNum(p), (int)pObjTargetPo < iVar1;
          pObjTargetPo._0_4_ = (int)pObjTargetPo + 1) {
        pAVar2 = Aig_ManCo(p,(int)pObjTargetPo);
        Aig_ObjChild0Flip(pAVar2);
      }
      Aig_ManStop(p);
      return pObjTargetPo._4_4_;
    }
    exit(0);
  }
  __assert_fail("Aig_ManCheck( pAig )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                ,0x178,"int flipConePdr(Aig_Man_t *, int, int, int, int)");
}

Assistant:

int flipConePdr( Aig_Man_t *pAig, int directive, int targetCSPropertyIndex, int safetyInvariantPOIndex, int absorberCount )
{
	int RetValue, i;
	Aig_Obj_t *pObjTargetPo;
	Aig_Man_t *pAigDupl;
	Pdr_Par_t Pars, * pPars = &Pars;
	Abc_Cex_t * pCex = NULL;

	char *fileName;
	
	fileName = (char *)malloc(sizeof(char) * 50);
	sprintf(fileName, "%s_%d.%s", "kLive", absorberCount, "blif" );

	if( directive == kCS_WITH_SAFETY_INVARIANTS || directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS || directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS )
	{
		assert( safetyInvariantPOIndex != -1 );
		modifyAigToApplySafetyInvar(pAig, targetCSPropertyIndex, safetyInvariantPOIndex);
	}

	pAigDupl = pAig;
	pAig = Aig_ManDupSimple( pAigDupl );

	for( i=0; i<Saig_ManPoNum(pAig); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAig, i );
		Aig_ObjChild0Flip( pObjTargetPo );
	}

	Pdr_ManSetDefaultParams( pPars );
	pPars->fVerbose = 1;
	pPars->fNotVerbose = 1;
	pPars->fSolveAll = 1;
	pAig->vSeqModelVec = NULL;

	Aig_ManCleanup( pAig );
	assert( Aig_ManCheck( pAig ) );

	Pdr_ManSolve( pAig, pPars );	

	if( pAig->vSeqModelVec )
	{
		pCex = (Abc_Cex_t *)Vec_PtrEntry( pAig->vSeqModelVec, targetCSPropertyIndex );
		if( pCex == NULL )
		{
			RetValue = 1;
		}
		else
			RetValue = 0;
	}
	else
	{
		RetValue = -1;
		exit(0);
	}

	free(fileName);

	for( i=0; i<Saig_ManPoNum(pAig); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAig, i );
		Aig_ObjChild0Flip( pObjTargetPo );
	}
	
	Aig_ManStop( pAig );
	return RetValue;
}